

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O2

Path<SimpleState_*> * __thiscall
xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Path<SimpleState_*> *__return_storage_ptr__,AStar *this,
          Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal,
          CalcHeuristicFunc_t<SimpleState_*,_double> *calc_heuristic)

{
  VertexMapTypeIterator graph_00;
  VertexMapTypeIterator start_vtx;
  undefined4 in_register_00000084;
  vertex_iterator *wp;
  pointer pvVar1;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_stack_ffffffffffffff68;
  _Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  local_90;
  function<double_(SimpleState_*,_SimpleState_*)> local_78;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  Graph<SimpleState_*,_double,_SimpleStateIndexer>::ResetAllVertices
            ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)this);
  graph_00.
  super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
             )Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                        ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)this,(long)(int)graph);
  start_vtx.
  super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
             )Graph<SimpleState_*,_double,_SimpleStateIndexer>::FindVertex
                        ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)this,(long)start);
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (start_vtx.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0 &&
      graph_00.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::function<double_(SimpleState_*,_SimpleState_*)>::function
              (&local_78,
               (function<double_(SimpleState_*,_SimpleState_*)> *)
               CONCAT44(in_register_00000084,goal));
    local_48 = 0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              ((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                *)&local_90,this,
               (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)
               graph_00.
               super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
               ._M_cur,(vertex_iterator)
                       start_vtx.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                       ._M_cur,(vertex_iterator)&local_78,
               (CalcHeuristicFunc_t<SimpleState_*,_double> *)&local_58,in_stack_ffffffffffffff68);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::_Function_base::~_Function_base(&local_78.super__Function_base);
    for (pvVar1 = local_90._M_impl.super__Vector_impl_data._M_start;
        pvVar1 != local_90._M_impl.super__Vector_impl_data._M_finish; pvVar1 = pvVar1 + 1) {
      std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::push_back
                (__return_storage_ptr__,
                 *(value_type **)
                  ((long)&(((pvVar1->super_const_vertex_iterator).super_VertexMapTypeIterator.
                            super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                           ._M_cur)->
                          super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>
                          ._M_storage._M_storage + 8));
    }
    std::
    _Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::~_Vector_base(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

static Path<State> Search(
      Graph<State, Transition, StateIndexer> *graph, VertexIdentifier start,
      VertexIdentifier goal,
      CalcHeuristicFunc_t<State, Transition> calc_heuristic) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it, calc_heuristic);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }